

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifold_surface_mesh.cpp
# Opt level: O0

Vertex __thiscall
geometrycentral::surface::ManifoldSurfaceMesh::insertVertex(ManifoldSurfaceMesh *this,Face fIn)

{
  bool bVar1;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> *pEVar2;
  Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh> *pEVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  size_t sVar7;
  size_t sVar8;
  reference pvVar9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar10;
  long in_RDI;
  Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh> EVar11;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> EVar12;
  Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh> EVar13;
  Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh> EVar14;
  Halfedge prevLeadingHe;
  Halfedge nextTrailingHe;
  Halfedge boundaryHe;
  Halfedge trailingHe;
  Halfedge leadingHe;
  Edge prevE;
  Edge e;
  Face f;
  size_t i_1;
  Halfedge he;
  NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator> __end2;
  NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator> __begin2;
  NavigationSetBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator> *__range2;
  vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
  faceBoundaryHalfedges;
  Halfedge newHe;
  size_t i;
  vector<geometrycentral::surface::Edge,_std::allocator<geometrycentral::surface::Edge>_> innerEdges
  ;
  vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
  trailingHalfedges;
  vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
  leadingHalfedges;
  vector<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_> innerFaces
  ;
  size_t faceDegree;
  Vertex centerVert;
  NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator>
  *in_stack_fffffffffffffc08;
  SurfaceMesh *in_stack_fffffffffffffc10;
  value_type *in_stack_fffffffffffffc18;
  NavigationSetBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator>
  *in_stack_fffffffffffffc20;
  size_type in_stack_fffffffffffffc28;
  SurfaceMesh *in_stack_fffffffffffffc30;
  Face *in_stack_fffffffffffffc80;
  undefined8 in_stack_fffffffffffffdc8;
  SurfaceMesh *in_stack_fffffffffffffdd0;
  Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh> local_228;
  ParentMeshT *local_218;
  size_t sStack_210;
  ParentMeshT *local_208;
  size_t sStack_200;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_1f8;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_1e8;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_1d8;
  ParentMeshT *local_1c8;
  size_t sStack_1c0;
  ParentMeshT *local_1b8;
  size_t sStack_1b0;
  Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh> local_1a8;
  size_type local_190;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_188;
  NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator> local_178 [2];
  NavigationSetBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator> local_148;
  NavigationSetBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator> *local_120;
  vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
  local_118;
  Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh> local_100;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_f0;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_e0;
  Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh> local_d0;
  ulong local_c0;
  vector<geometrycentral::surface::Edge,_std::allocator<geometrycentral::surface::Edge>_> local_b0;
  vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
  local_90 [2];
  vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
  local_60;
  vector<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_> local_48;
  size_t local_30;
  Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh> local_10;
  
  local_10 = (Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>)
             SurfaceMesh::getNewVertex(in_stack_fffffffffffffc30);
  local_30 = Face::degree(in_stack_fffffffffffffc80);
  ::std::vector<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_>::
  vector((vector<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_> *)
         0x200fc6);
  ::std::allocator<geometrycentral::surface::Halfedge>::allocator
            ((allocator<geometrycentral::surface::Halfedge> *)0x200feb);
  ::std::
  vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>::
  vector((vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
          *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
         (allocator_type *)in_stack_fffffffffffffc20);
  ::std::allocator<geometrycentral::surface::Halfedge>::~allocator
            ((allocator<geometrycentral::surface::Halfedge> *)0x201017);
  ::std::allocator<geometrycentral::surface::Halfedge>::allocator
            ((allocator<geometrycentral::surface::Halfedge> *)0x20103c);
  ::std::
  vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>::
  vector((vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
          *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
         (allocator_type *)in_stack_fffffffffffffc20);
  ::std::allocator<geometrycentral::surface::Halfedge>::~allocator
            ((allocator<geometrycentral::surface::Halfedge> *)0x201068);
  ::std::allocator<geometrycentral::surface::Edge>::allocator
            ((allocator<geometrycentral::surface::Edge> *)0x20108d);
  ::std::vector<geometrycentral::surface::Edge,_std::allocator<geometrycentral::surface::Edge>_>::
  vector((vector<geometrycentral::surface::Edge,_std::allocator<geometrycentral::surface::Edge>_> *)
         in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
         (allocator_type *)in_stack_fffffffffffffc20);
  ::std::allocator<geometrycentral::surface::Edge>::~allocator
            ((allocator<geometrycentral::surface::Edge> *)0x2010b9);
  for (local_c0 = 0; local_c0 < local_30; local_c0 = local_c0 + 1) {
    if (local_c0 == 0) {
      ::std::vector<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_>
      ::push_back((vector<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_>
                   *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
    }
    else {
      EVar11 = (Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>)
               SurfaceMesh::getNewFace(in_stack_fffffffffffffc10);
      local_d0 = EVar11;
      ::std::vector<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_>
      ::push_back((vector<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_>
                   *)in_stack_fffffffffffffc10,(value_type *)in_stack_fffffffffffffc08);
    }
    EVar12 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>)
             SurfaceMesh::getNewEdgeTriple
                       (in_stack_fffffffffffffdd0,SUB81((ulong)in_stack_fffffffffffffdc8 >> 0x38,0))
    ;
    local_e0 = EVar12;
    pEVar2 = &::std::
              vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
              ::operator[](&local_60,local_c0)->
              super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
    ;
    *pEVar2 = local_e0;
    EVar12 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>)
             Halfedge::twin((Halfedge *)in_stack_fffffffffffffc10);
    local_f0 = EVar12;
    pEVar2 = &::std::
              vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
              ::operator[](local_90,(local_c0 + 1) % local_30)->
              super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
    ;
    *pEVar2 = local_f0;
    EVar13 = (Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>)
             Halfedge::edge((Halfedge *)in_stack_fffffffffffffc10);
    local_100 = EVar13;
    pEVar3 = &::std::
              vector<geometrycentral::surface::Edge,_std::allocator<geometrycentral::surface::Edge>_>
              ::operator[](&local_b0,local_c0)->
              super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>;
    *pEVar3 = local_100;
  }
  ::std::
  vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>::
  vector((vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
          *)0x201351);
  Face::adjacentHalfedges((Face *)in_stack_fffffffffffffc20);
  local_120 = &local_148;
  NavigationSetBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator>::begin
            (in_stack_fffffffffffffc20);
  NavigationSetBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator>::end
            (local_178,local_120);
  while( true ) {
    bVar1 = NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator>::
            operator!=((NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator>
                        *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
    if (!bVar1) break;
    EVar12 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>)
             NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator>::
             operator*((NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator>
                        *)0x2013e3);
    local_188 = EVar12;
    ::std::
    vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
    ::push_back((vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
                 *)in_stack_fffffffffffffc20,(value_type *)in_stack_fffffffffffffc18);
    NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator>::operator++
              ((NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator> *)
               in_stack_fffffffffffffc10);
  }
  for (local_190 = 0; local_190 < local_30; local_190 = local_190 + 1) {
    pvVar4 = ::std::
             vector<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_>
             ::operator[](&local_48,local_190);
    local_1a8.mesh =
         (pvVar4->
         super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>).mesh;
    local_1a8.ind =
         (pvVar4->
         super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>).ind;
    pvVar5 = ::std::
             vector<geometrycentral::surface::Edge,_std::allocator<geometrycentral::surface::Edge>_>
             ::operator[](&local_b0,local_190);
    local_1b8 = (pvVar5->
                super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                ).mesh;
    sStack_1b0 = (pvVar5->
                 super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                 ).ind;
    pvVar5 = ::std::
             vector<geometrycentral::surface::Edge,_std::allocator<geometrycentral::surface::Edge>_>
             ::operator[](&local_b0,((local_190 - 1) + local_30) % local_30);
    local_1c8 = (pvVar5->
                super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                ).mesh;
    sStack_1c0 = (pvVar5->
                 super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                 ).ind;
    pvVar6 = ::std::
             vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
             ::operator[](&local_60,local_190);
    local_1d8.mesh =
         (pvVar6->
         super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>).
         mesh;
    local_1d8.ind =
         (pvVar6->
         super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>).
         ind;
    pvVar6 = ::std::
             vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
             ::operator[](local_90,local_190);
    local_1e8.mesh =
         (pvVar6->
         super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>).
         mesh;
    local_1e8.ind =
         (pvVar6->
         super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>).
         ind;
    pvVar6 = ::std::
             vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
             ::operator[](&local_118,local_190);
    local_1f8.mesh =
         (pvVar6->
         super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>).
         mesh;
    local_1f8.ind =
         (pvVar6->
         super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>).
         ind;
    pvVar6 = ::std::
             vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
             ::operator[](local_90,(local_190 + 1) % local_30);
    local_208 = (pvVar6->
                super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                ).mesh;
    sStack_200 = (pvVar6->
                 super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                 ).ind;
    pvVar6 = ::std::
             vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
             ::operator[](&local_60,((local_190 - 1) + local_30) % local_30);
    local_218 = (pvVar6->
                super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                ).mesh;
    sStack_210 = (pvVar6->
                 super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                 ).ind;
    sVar7 = Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>::
            getIndex(&local_1f8);
    sVar8 = Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>::getIndex
                      (&local_1a8);
    pvVar9 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x170),
                        sVar8);
    *pvVar9 = sVar7;
    sVar7 = Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>::
            getIndex(&local_1e8);
    sVar8 = Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>::
            getIndex(&local_1d8);
    pvVar9 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x110),
                        sVar8);
    *pvVar9 = sVar7;
    Halfedge::next((Halfedge *)in_stack_fffffffffffffc10);
    EVar14 = (Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>)
             Halfedge::vertex((Halfedge *)in_stack_fffffffffffffc10);
    local_228 = EVar14;
    sVar7 = Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>::
            getIndex(&local_228);
    sVar8 = Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>::
            getIndex(&local_1d8);
    pvVar9 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x128),
                        sVar8);
    *pvVar9 = sVar7;
    sVar7 = Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>::getIndex
                      (&local_1a8);
    sVar8 = Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>::
            getIndex(&local_1d8);
    pvVar9 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x140),
                        sVar8);
    *pvVar9 = sVar7;
    sVar7 = Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>::
            getIndex(&local_1f8);
    pvVar10 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x110);
    sVar8 = Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>::
            getIndex(&local_1e8);
    pvVar9 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar10,sVar8)
    ;
    *pvVar9 = sVar7;
    sVar7 = Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>::
            getIndex(&local_10);
    sVar8 = Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>::
            getIndex(&local_1e8);
    pvVar9 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x128),
                        sVar8);
    *pvVar9 = sVar7;
    sVar7 = Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>::getIndex
                      (&local_1a8);
    sVar8 = Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>::
            getIndex(&local_1e8);
    pvVar9 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x140),
                        sVar8);
    *pvVar9 = sVar7;
    sVar7 = Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>::
            getIndex(&local_1d8);
    sVar8 = Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>::
            getIndex(&local_1f8);
    pvVar9 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x110),
                        sVar8);
    *pvVar9 = sVar7;
    sVar7 = Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>::getIndex
                      (&local_1a8);
    in_stack_fffffffffffffc20 =
         (NavigationSetBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator> *)
         (in_RDI + 0x140);
    sVar8 = Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>::
            getIndex(&local_1f8);
    pvVar9 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_fffffffffffffc20,sVar8);
    *pvVar9 = sVar7;
  }
  pEVar2 = &::std::
            vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
            ::operator[](local_90,0)->
            super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
  ;
  sVar7 = Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>::
          getIndex(pEVar2);
  pvVar10 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x158);
  sVar8 = Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>::getIndex
                    (&local_10);
  pvVar9 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar10,sVar8);
  *pvVar9 = sVar7;
  *(long *)(in_RDI + 0x300) = *(long *)(in_RDI + 0x300) + 1;
  ::std::
  vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>::
  ~vector((vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
           *)in_stack_fffffffffffffc20);
  ::std::vector<geometrycentral::surface::Edge,_std::allocator<geometrycentral::surface::Edge>_>::
  ~vector((vector<geometrycentral::surface::Edge,_std::allocator<geometrycentral::surface::Edge>_> *
          )in_stack_fffffffffffffc20);
  ::std::
  vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>::
  ~vector((vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
           *)in_stack_fffffffffffffc20);
  ::std::
  vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>::
  ~vector((vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
           *)in_stack_fffffffffffffc20);
  ::std::vector<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_>::
  ~vector((vector<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_> *
          )in_stack_fffffffffffffc20);
  return (Vertex)local_10;
}

Assistant:

Vertex ManifoldSurfaceMesh::insertVertex(Face fIn) {

  // Create the new center vertex
  Vertex centerVert = getNewVertex();

  // Count degree to allocate elements
  size_t faceDegree = fIn.degree();

  // == Create new halfedges/edges/faces around the center vertex

  // Create all of the new elements first, then hook them up below
  std::vector<Face> innerFaces;
  std::vector<Halfedge> leadingHalfedges(faceDegree); // the one that points towards the center
  std::vector<Halfedge> trailingHalfedges(faceDegree);
  std::vector<Edge> innerEdges(faceDegree); // aligned with leading he
  for (size_t i = 0; i < faceDegree; i++) {
    // Re-use first face
    if (i == 0) {
      innerFaces.push_back(fIn);
    } else {
      innerFaces.push_back(getNewFace());
    }

    // Get the new edge group
    Halfedge newHe = getNewEdgeTriple(false);

    leadingHalfedges[i] = newHe;
    trailingHalfedges[(i + 1) % faceDegree] = newHe.twin();
    innerEdges[i] = newHe.edge();
  }

  // Form this list before we start, because we're about to start breaking pointers
  std::vector<Halfedge> faceBoundaryHalfedges;
  for (Halfedge he : fIn.adjacentHalfedges()) {
    faceBoundaryHalfedges.push_back(he);
  }

  // Connect up all the pointers
  // Each iteration processes one inner face
  for (size_t i = 0; i < faceDegree; i++) {

    // Gather pointers
    Face f = innerFaces[i];
    Edge e = innerEdges[i];
    Edge prevE = innerEdges[(i + faceDegree - 1) % faceDegree];
    Halfedge leadingHe = leadingHalfedges[i];
    Halfedge trailingHe = trailingHalfedges[i];
    Halfedge boundaryHe = faceBoundaryHalfedges[i];
    Halfedge nextTrailingHe = trailingHalfedges[(i + 1) % faceDegree];
    Halfedge prevLeadingHe = leadingHalfedges[(i + faceDegree - 1) % faceDegree];

    // face
    fHalfedgeArr[f.getIndex()] = boundaryHe.getIndex();

    // leading halfedge
    heNextArr[leadingHe.getIndex()] = trailingHe.getIndex();
    heVertexArr[leadingHe.getIndex()] = boundaryHe.next().vertex().getIndex();
    heFaceArr[leadingHe.getIndex()] = f.getIndex();

    // trailing halfedge
    heNextArr[trailingHe.getIndex()] = boundaryHe.getIndex();
    heVertexArr[trailingHe.getIndex()] = centerVert.getIndex();
    heFaceArr[trailingHe.getIndex()] = f.getIndex();

    // boundary halfedge
    heNextArr[boundaryHe.getIndex()] = leadingHe.getIndex();
    heFaceArr[boundaryHe.getIndex()] = f.getIndex();
  }

  vHalfedgeArr[centerVert.getIndex()] = trailingHalfedges[0].getIndex();

  modificationTick++;
  return centerVert;
}